

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

lua_State * lj_state_newstate(lua_Alloc f,void *ud)

{
  int iVar1;
  uint32_t uVar2;
  void *in_RSI;
  lua_Alloc in_RDI;
  global_State *g;
  lua_State *L;
  GG_State *GG;
  lua_State *L_00;
  GG_State *local_18;
  
  local_18 = (GG_State *)(*in_RDI)(in_RSI,(void *)0x0,0,0x15a8);
  L_00 = (lua_State *)&local_18->g;
  if ((local_18 == (GG_State *)0x0) || (local_18 != (GG_State *)((ulong)local_18 & 0xffffffff))) {
    local_18 = (GG_State *)0x0;
  }
  else {
    memset(local_18,0,0x15a8);
    (local_18->L).gct = '\x06';
    (local_18->L).marked = 'a';
    (local_18->L).dummy_ffid = '\x01';
    uVar2 = (uint32_t)L_00;
    (local_18->L).glref.ptr32 = uVar2;
    *(uint8_t *)&L_00[1].top = '!';
    L_00[3].field_0x3c = 1;
    L_00[3].field_0x3d = 4;
    *(lua_Alloc *)(L_00 + 1) = in_RDI;
    *(void **)&L_00[1].glref = in_RSI;
    *(uint32_t *)&L_00[4].base = (uint32_t)local_18;
    *(uint32_t *)&L_00[5].base = uVar2 + 0x148;
    *(uint32_t *)((long)&L_00[5].base + 4) = uVar2 + 0x148;
    (L_00->glref).ptr32 = 0xffffffff;
    *(undefined4 *)((ulong)(local_18->L).glref.ptr32 + 0x11c) = 0xffffffff;
    *(undefined4 *)((long)&L_00[4].cframe + 4) = 0xffffffff;
    *(undefined4 *)&L_00[4].field_0x3c = 0xffffffff;
    ((MRef *)&L_00[5].marked)->ptr32 = uVar2 + 0x130;
    *(undefined4 *)((long)&L_00[3].cframe + 4) = 0;
    L_00[3].openupval.gcptr32 = 0;
    L_00[3].env.gcptr32 = 0;
    *(undefined4 *)&L_00[3].cframe = 0;
    *(uint8_t *)((long)&L_00[1].top + 1) = '\0';
    ((GCRef *)&L_00[1].maxstack)->gcptr32 = (uint32_t)local_18;
    L_00[1].stack.ptr32 = uVar2 + 0x60;
    ((GCState *)&L_00[1].base)->total = 0x15a8;
    L_00[2].top = (TValue *)0x15a8;
    *(MSize *)&L_00[2].marked = 200;
    L_00[2].nextgc.gcptr32 = 200;
    lj_dispatch_init(local_18);
    (local_18->L).status = '\x06';
    iVar1 = lj_vm_cpcall(local_18,0,0,cpluaopen);
    if (iVar1 == 0) {
      (local_18->L).status = '\0';
    }
    else {
      close_state(L_00);
      local_18 = (GG_State *)0x0;
    }
  }
  return &local_18->L;
}

Assistant:

lua_State *lj_state_newstate(lua_Alloc f, void *ud)
#else
LUA_API lua_State *lua_newstate(lua_Alloc f, void *ud)
#endif
{
  GG_State *GG = (GG_State *)f(ud, NULL, 0, sizeof(GG_State));
  lua_State *L = &GG->L;
  global_State *g = &GG->g;
  if (GG == NULL || !checkptrGC(GG)) return NULL;
  memset(GG, 0, sizeof(GG_State));
  L->gct = ~LJ_TTHREAD;
  L->marked = LJ_GC_WHITE0 | LJ_GC_FIXED | LJ_GC_SFIXED;  /* Prevent free. */
  L->dummy_ffid = FF_C;
  setmref(L->glref, g);
  g->gc.currentwhite = LJ_GC_WHITE0 | LJ_GC_FIXED;
  g->strempty.marked = LJ_GC_WHITE0;
  g->strempty.gct = ~LJ_TSTR;
  g->allocf = f;
  g->allocd = ud;
  setgcref(g->mainthref, obj2gco(L));
  setgcref(g->uvhead.prev, obj2gco(&g->uvhead));
  setgcref(g->uvhead.next, obj2gco(&g->uvhead));
  g->strmask = ~(MSize)0;
  setnilV(registry(L));
  setnilV(&g->nilnode.val);
  setnilV(&g->nilnode.key);
#if !LJ_GC64
  setmref(g->nilnode.freetop, &g->nilnode);
#endif
  lj_buf_init(NULL, &g->tmpbuf);
  g->gc.state = GCSpause;
  setgcref(g->gc.root, obj2gco(L));
  setmref(g->gc.sweep, &g->gc.root);
  g->gc.allocated = g->gc.total = sizeof(GG_State);
  g->gc.pause = LUAI_GCPAUSE;
  g->gc.stepmul = LUAI_GCMUL;
  lj_dispatch_init((GG_State *)L);
  L->status = LUA_ERRERR+1;  /* Avoid touching the stack upon memory error. */
  if (lj_vm_cpcall(L, NULL, NULL, cpluaopen) != 0) {
    /* Memory allocation error: free partial state. */
    close_state(L);
    return NULL;
  }
  L->status = LUA_OK;
  return L;
}